

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdb.c
# Opt level: O1

int mdb_env_copyfd2(MDB_env *env,int fd,uint flags)

{
  char *__dest;
  uint uVar1;
  MDB_db *pMVar2;
  pgno_t pVar3;
  pgno_t pVar4;
  pgno_t pVar5;
  mdb_size_t mVar6;
  pgno_t pVar7;
  MDB_txn *txn_00;
  undefined8 txn_01;
  int iVar8;
  ssize_t sVar9;
  int *piVar10;
  ulong uVar11;
  pthread_mutex_t *mutex;
  long lVar12;
  MDB_dbx *pMVar13;
  char *pcVar14;
  size_t sVar15;
  MDB_txn *txn;
  pthread_t thr;
  MDB_val key;
  stat st;
  MDB_txn *local_2a8;
  char *local_2a0;
  MDB_txn *local_298;
  pthread_t local_290;
  MDB_val local_288;
  MDB_val local_278;
  pthread_mutex_t local_268;
  pthread_cond_t local_240;
  char *local_210;
  char *local_208;
  MDB_env *local_1f0;
  MDB_txn *local_1e8;
  int local_1e0 [7];
  undefined4 local_1c4;
  int local_1c0;
  int local_1bc;
  MDB_cursor local_1b8;
  
  if ((flags & 1) != 0) {
    local_2a8 = (MDB_txn *)0x0;
    pthread_mutex_init((pthread_mutex_t *)&local_268,(pthread_mutexattr_t *)0x0);
    pthread_cond_init(&local_240,(pthread_condattr_t *)0x0);
    iVar8 = posix_memalign(&local_210,(ulong)env->me_os_psize,0x200000);
    local_208 = local_210;
    if (iVar8 != 0) {
      return iVar8;
    }
    memset(local_210,0,0x200000);
    local_208 = local_208 + 0x100000;
    local_1e0[0] = 0;
    local_1e0[1] = 0;
    local_1e0[2] = 0;
    local_1e0[3] = 0;
    local_1e0[4] = 2;
    local_1e0[5] = 0;
    local_1c4 = 0;
    local_1c0 = 1;
    local_1bc = 0;
    local_1f0 = env;
    local_1e0[6] = fd;
    pthread_create(&local_290,(pthread_attr_t *)0x0,mdb_env_copythr,&local_268);
    iVar8 = mdb_txn_begin(env,(MDB_txn *)0x0,0x20000,&local_2a8);
    pcVar14 = local_210;
    if (iVar8 != 0) {
      return iVar8;
    }
    lVar12 = 0;
    memset(local_210,0,(ulong)(env->me_psize * 2));
    pcVar14[0] = '\0';
    pcVar14[1] = '\0';
    pcVar14[2] = '\0';
    pcVar14[3] = '\0';
    pcVar14[4] = '\0';
    pcVar14[5] = '\0';
    pcVar14[6] = '\0';
    pcVar14[7] = '\0';
    pcVar14[10] = '\b';
    pcVar14[0xb] = '\0';
    pcVar14[0x10] = -0x22;
    pcVar14[0x11] = -0x40;
    pcVar14[0x12] = -0x11;
    pcVar14[0x13] = -0x42;
    pcVar14[0x14] = '\x01';
    pcVar14[0x15] = '\0';
    pcVar14[0x16] = '\0';
    pcVar14[0x17] = '\0';
    *(mdb_size_t *)(pcVar14 + 0x20) = env->me_mapsize;
    uVar1 = env->me_psize;
    *(uint *)(pcVar14 + 0x28) = uVar1;
    pcVar14[0x88] = '\x01';
    pcVar14[0x89] = '\0';
    pcVar14[0x8a] = '\0';
    pcVar14[0x8b] = '\0';
    pcVar14[0x8c] = '\0';
    pcVar14[0x8d] = '\0';
    pcVar14[0x8e] = '\0';
    pcVar14[0x8f] = '\0';
    *(ushort *)(pcVar14 + 0x2c) = (ushort)env->me_flags | 8;
    pcVar14[0x50] = -1;
    pcVar14[0x51] = -1;
    pcVar14[0x52] = -1;
    pcVar14[0x53] = -1;
    pcVar14[0x54] = -1;
    pcVar14[0x55] = -1;
    pcVar14[0x56] = -1;
    pcVar14[0x57] = -1;
    pcVar14[0x80] = -1;
    pcVar14[0x81] = -1;
    pcVar14[0x82] = -1;
    pcVar14[0x83] = -1;
    pcVar14[0x84] = -1;
    pcVar14[0x85] = -1;
    pcVar14[0x86] = -1;
    pcVar14[0x87] = -1;
    *(void **)(pcVar14 + 0x18) = env->me_metas[0]->mm_address;
    local_2a0 = local_210 + uVar1;
    __dest = local_210 + (ulong)uVar1 + 0x10;
    __dest[-0x10] = '\x01';
    __dest[-0xf] = '\0';
    __dest[-0xe] = '\0';
    __dest[-0xd] = '\0';
    __dest[-0xc] = '\0';
    __dest[-0xb] = '\0';
    __dest[-10] = '\0';
    __dest[-9] = '\0';
    __dest[-6] = '\b';
    __dest[-5] = '\0';
    memcpy(__dest,pcVar14 + 0x10,0x88);
    local_298 = local_2a8;
    mdb_cursor_init(&local_1b8,local_2a8,0,(MDB_xcursor *)0x0);
    iVar8 = mdb_cursor_get(&local_1b8,&local_278,&local_288,MDB_NEXT);
    if (iVar8 == 0) {
      lVar12 = 0;
      do {
        lVar12 = lVar12 + *local_288.mv_data;
        iVar8 = mdb_cursor_get(&local_1b8,&local_278,&local_288,MDB_NEXT);
      } while (iVar8 == 0);
    }
    txn_00 = local_298;
    pMVar2 = local_298->mt_dbs;
    uVar11 = ~(lVar12 + pMVar2->md_branch_pages + pMVar2->md_leaf_pages + pMVar2->md_overflow_pages)
             + local_298->mt_next_pgno;
    *(ulong *)(local_2a0 + 0x88) = uVar11;
    pVar3 = pMVar2[1].md_branch_pages;
    pVar4 = pMVar2[1].md_leaf_pages;
    pVar5 = pMVar2[1].md_overflow_pages;
    mVar6 = pMVar2[1].md_entries;
    pVar7 = pMVar2[1].md_root;
    *(undefined8 *)(local_2a0 + 0x58) = *(undefined8 *)(pMVar2 + 1);
    *(pgno_t *)(local_2a0 + 0x60) = pVar3;
    *(pgno_t *)(local_2a0 + 0x68) = pVar4;
    *(pgno_t *)(local_2a0 + 0x70) = pVar5;
    *(mdb_size_t *)(local_2a0 + 0x78) = mVar6;
    *(pgno_t *)(local_2a0 + 0x80) = pVar7;
    if (uVar11 < 2) {
      local_2a0[0x80] = -1;
      local_2a0[0x81] = -1;
      local_2a0[0x82] = -1;
      local_2a0[0x83] = -1;
      local_2a0[0x84] = -1;
      local_2a0[0x85] = -1;
      local_2a0[0x86] = -1;
      local_2a0[0x87] = -1;
    }
    else {
      *(ulong *)(local_2a0 + 0x80) = uVar11;
      local_2a0[0x90] = '\x01';
      local_2a0[0x91] = '\0';
      local_2a0[0x92] = '\0';
      local_2a0[0x93] = '\0';
      local_2a0[0x94] = '\0';
      local_2a0[0x95] = '\0';
      local_2a0[0x96] = '\0';
      local_2a0[0x97] = '\0';
    }
    local_1e0[0] = env->me_psize * 2;
    local_1e8 = local_298;
    pthread_mutex_lock((pthread_mutex_t *)&local_268);
    if (local_1c0 != 0) {
      do {
        pthread_cond_wait(&local_240,(pthread_mutex_t *)&local_268);
      } while (local_1c0 != 0);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&local_268);
    iVar8 = mdb_env_cwalk((mdb_copy *)&local_268.__data,&txn_00->mt_dbs[1].md_root,0);
    if ((iVar8 == 0) && (iVar8 = 0, local_1e0[local_1bc] != 0)) {
      iVar8 = mdb_env_cthr_toggle((mdb_copy *)&local_268.__data,1);
    }
    mdb_env_cthr_toggle((mdb_copy *)&local_268.__data,-1);
    pthread_mutex_lock((pthread_mutex_t *)&local_268);
    if (local_1c0 != 0) {
      do {
        pthread_cond_wait(&local_240,(pthread_mutex_t *)&local_268);
      } while (local_1c0 != 0);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&local_268);
    pthread_join(local_290,(void **)0x0);
    mdb_txn_abort(txn_00);
    pthread_cond_destroy(&local_240);
    pthread_mutex_destroy((pthread_mutex_t *)&local_268);
    free(local_210);
    return iVar8;
  }
  local_268.__align = 0;
  iVar8 = mdb_txn_begin(env,(MDB_txn *)0x0,0x20000,(MDB_txn **)&local_268.__align);
  txn_01 = local_268.__align;
  if (iVar8 != 0) {
    return iVar8;
  }
  mutex = (pthread_mutex_t *)0x0;
  if (env->me_txns != (MDB_txninfo *)0x0) {
    mdb_txn_end((MDB_txn *)local_268.__align,4);
    mutex = (pthread_mutex_t *)&env->me_txns->mt2;
    iVar8 = pthread_mutex_lock(mutex);
    if ((iVar8 != 0) && (iVar8 = mdb_mutex_failed(env,(mdb_mutexref_t)mutex,iVar8), iVar8 != 0))
    goto LAB_0010f844;
    iVar8 = mdb_txn_renew0((MDB_txn *)txn_01);
    if (iVar8 != 0) {
      pthread_mutex_unlock(mutex);
      goto LAB_0010f844;
    }
  }
  pcVar14 = env->me_map;
  uVar1 = env->me_psize * 2;
  sVar15 = (ulong)uVar1;
  if (uVar1 != 0) {
    do {
      sVar9 = write(fd,pcVar14,sVar15);
      if (sVar9 < 0) {
        piVar10 = __errno_location();
        iVar8 = *piVar10;
        goto LAB_0010f7f5;
      }
      if (sVar9 == 0) {
        iVar8 = 5;
        goto LAB_0010f7f5;
      }
      pcVar14 = pcVar14 + sVar9;
      sVar15 = sVar15 - sVar9;
    } while (sVar15 != 0);
  }
  iVar8 = 0;
LAB_0010f7f5:
  if (mutex != (pthread_mutex_t *)0x0) {
    pthread_mutex_unlock(mutex);
  }
  if (iVar8 == 0) {
    pMVar13 = (MDB_dbx *)((ulong)env->me_psize * *(pgno_t *)(local_268.__align + 0x10));
    iVar8 = fstat(env->me_fd,(stat *)&local_1b8);
    if (iVar8 == 0) {
      iVar8 = 0;
    }
    else {
      piVar10 = __errno_location();
      iVar8 = *piVar10;
      local_1b8.mc_dbx = (MDB_dbx *)0x0;
    }
    if (iVar8 == 0) {
      if (pMVar13 < local_1b8.mc_dbx) {
        local_1b8.mc_dbx = pMVar13;
      }
      uVar11 = (long)local_1b8.mc_dbx - (ulong)uVar1;
      if (uVar11 != 0) {
        iVar8 = 0;
        do {
          sVar15 = 0x40000000;
          if (uVar11 < 0x40000000) {
            sVar15 = uVar11;
          }
          sVar9 = write(fd,pcVar14,sVar15);
          if (sVar9 < 0) {
            piVar10 = __errno_location();
            iVar8 = *piVar10;
            break;
          }
          if (sVar9 == 0) {
            iVar8 = 5;
            break;
          }
          pcVar14 = pcVar14 + sVar9;
          uVar11 = uVar11 - sVar9;
        } while (uVar11 != 0);
      }
    }
  }
LAB_0010f844:
  mdb_txn_abort((MDB_txn *)local_268.__align);
  return iVar8;
}

Assistant:

int ESECT
mdb_env_copyfd2(MDB_env *env, HANDLE fd, unsigned int flags)
{
	if (flags & MDB_CP_COMPACT)
		return mdb_env_copyfd1(env, fd);
	else
		return mdb_env_copyfd0(env, fd);
}